

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtable.cpp
# Opt level: O3

size_t FStringTable::ProcessEscapes(char *iptr)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  char *optr;
  
  pbVar2 = (byte *)iptr;
  pbVar3 = (byte *)iptr;
  do {
    pbVar1 = pbVar3 + 1;
    do {
      pbVar3 = pbVar1;
      bVar4 = pbVar3[-1];
      if (bVar4 != 0x5c) {
        if (bVar4 == 0) {
          *pbVar2 = 0;
          return (long)pbVar2 - (long)iptr;
        }
        goto LAB_005a0f66;
      }
      bVar4 = *pbVar3;
      pbVar1 = pbVar3 + 2;
    } while (bVar4 == 10);
    if (bVar4 < 0x72) {
      if (bVar4 == 99) {
        pbVar3 = pbVar3 + 1;
        bVar4 = 0x1c;
      }
      else if (bVar4 == 0x6e) {
        pbVar3 = pbVar3 + 1;
        bVar4 = 10;
      }
      else {
LAB_005a0f55:
        pbVar3 = pbVar3 + 1;
      }
    }
    else if (bVar4 == 0x72) {
      pbVar3 = pbVar3 + 1;
      bVar4 = 0xd;
    }
    else {
      if (bVar4 != 0x74) goto LAB_005a0f55;
      pbVar3 = pbVar3 + 1;
      bVar4 = 9;
    }
LAB_005a0f66:
    *pbVar2 = bVar4;
    pbVar2 = pbVar2 + 1;
  } while( true );
}

Assistant:

size_t FStringTable::ProcessEscapes (char *iptr)
{
	char *sptr = iptr, *optr = iptr, c;

	while ((c = *iptr++) != '\0')
	{
		if (c == '\\')
		{
			c = *iptr++;
			if (c == 'n')
				c = '\n';
			else if (c == 'c')
				c = TEXTCOLOR_ESCAPE;
			else if (c == 'r')
				c = '\r';
			else if (c == 't')
				c = '\t';
			else if (c == '\n')
				continue;
		}
		*optr++ = c;
	}
	*optr = '\0';
	return optr - sptr;
}